

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2016.h
# Opt level: O0

void __thiscall PRED<UFPC>::SecondScan(PRED<UFPC> *this)

{
  uint uVar1;
  uint *puVar2;
  uint *e;
  uint *b;
  int r_i;
  PRED<UFPC> *this_local;
  
  uVar1 = UFPC::Flatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar1;
  for (b._4_4_ = 0;
      b._4_4_ < *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x8
      ; b._4_4_ = b._4_4_ + 1) {
    e = cv::Mat::ptr<unsigned_int>
                  (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                   b._4_4_);
    puVar2 = e + *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                          field_0xc;
    for (; e != puVar2; e = e + 1) {
      uVar1 = UFPC::GetLabel(*e);
      *e = uVar1;
    }
  }
  return;
}

Assistant:

void SecondScan()
    {
        // Second scan
        n_labels_ = LabelsSolver::Flatten();

        for (int r_i = 0; r_i < img_labels_.rows; ++r_i) {
            unsigned int *b = img_labels_.ptr<unsigned int>(r_i);
            unsigned int *e = b + img_labels_.cols;
            for (; b != e; ++b) {
                *b = LabelsSolver::GetLabel(*b);
            }
        }
    }